

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosDynamicBinder.cpp
# Opt level: O1

void __thiscall adios2::helper::DynamicBinder::~DynamicBinder(DynamicBinder *this)

{
  _Head_base<0UL,_adios2::helper::DynamicBinder::Impl_*,_false> _Var1;
  pointer *__ptr;
  
  adios2sys::DynamicLoader::CloseLibrary
            (((this->m_Impl)._M_t.
              super___uniq_ptr_impl<adios2::helper::DynamicBinder::Impl,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_adios2::helper::DynamicBinder::Impl_*,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
              .super__Head_base<0UL,_adios2::helper::DynamicBinder::Impl_*,_false>._M_head_impl)->
             m_LibraryHandle);
  _Var1._M_head_impl =
       (this->m_Impl)._M_t.
       super___uniq_ptr_impl<adios2::helper::DynamicBinder::Impl,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_adios2::helper::DynamicBinder::Impl_*,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
       .super__Head_base<0UL,_adios2::helper::DynamicBinder::Impl_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (Impl *)0x0) {
    operator_delete(_Var1._M_head_impl);
  }
  (this->m_Impl)._M_t.
  super___uniq_ptr_impl<adios2::helper::DynamicBinder::Impl,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_adios2::helper::DynamicBinder::Impl_*,_std::default_delete<adios2::helper::DynamicBinder::Impl>_>
  .super__Head_base<0UL,_adios2::helper::DynamicBinder::Impl_*,_false>._M_head_impl = (Impl *)0x0;
  return;
}

Assistant:

DynamicBinder::~DynamicBinder() { adios2sys::DynamicLoader::CloseLibrary(m_Impl->m_LibraryHandle); }